

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *x)

{
  uint uVar1;
  uint uVar2;
  FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
  *this_00;
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *pFVar3;
  long lVar4;
  double dVar5;
  int iVar6;
  double *pdVar7;
  Fad<Fad<double>_> *pFVar8;
  bool bVar9;
  void *pvVar10;
  double *pdVar11;
  ulong uVar12;
  uint ssize;
  ulong uVar13;
  ulong uVar14;
  value_type local_60;
  ulong local_40;
  Fad<Fad<double>_> *local_38;
  
  this_00 = &((x->fadexpr_).left_)->fadexpr_;
  pFVar3 = (this_00->left_->fadexpr_).right_;
  uVar1 = (((this_00->left_->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  ssize = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar2) {
    ssize = uVar2;
  }
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (this_00->right_->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (((x->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (ssize != 0) {
    local_40 = (ulong)*(uint *)(this + 0x28);
    if (local_40 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
      pdVar11 = *(double **)(this + 0x30);
      bVar9 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(&((x->fadexpr_).left_)->fadexpr_);
      if ((bVar9) && ((((x->fadexpr_).right_)->dx_).num_elts != 0)) {
        if (0 < (int)ssize) {
          uVar14 = 0;
          do {
            FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            ::fastAccessDx(&local_60,&x->fadexpr_,(int)uVar14);
            *pdVar11 = local_60.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar11 + 1),&local_60.dx_);
            pdVar11[3] = local_60.defaultVal;
            Fad<double>::~Fad(&local_60);
            uVar14 = uVar14 + 1;
            pdVar11 = pdVar11 + 4;
          } while (ssize != uVar14);
        }
      }
      else if (0 < (int)ssize) {
        uVar14 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_60,&x->fadexpr_,(int)uVar14);
          *pdVar11 = local_60.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar11 + 1),&local_60.dx_);
          pdVar11[3] = local_60.defaultVal;
          Fad<double>::~Fad(&local_60);
          uVar14 = uVar14 + 1;
          pdVar11 = pdVar11 + 4;
        } while (ssize != uVar14);
      }
    }
    else {
      lVar4 = *(long *)(this + 0x30);
      bVar9 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(this_00);
      if ((bVar9) && ((((x->fadexpr_).right_)->dx_).num_elts != 0)) {
        if (0 < (int)local_40) {
          uVar14 = 0;
          do {
            FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            ::fastAccessDx(&local_60,&x->fadexpr_,(int)uVar14);
            pdVar7 = local_60.dx_.ptr_to_data;
            iVar6 = local_60.dx_.num_elts;
            pdVar11 = (double *)(uVar14 * 0x20 + lVar4);
            uVar12 = (ulong)(uint)local_60.dx_.num_elts;
            if (uVar12 != 0) {
              uVar1 = *(uint *)(lVar4 + 8 + uVar14 * 0x20);
              if ((ulong)uVar1 == 0) {
                *(int *)(pdVar11 + 1) = local_60.dx_.num_elts;
                uVar13 = uVar12 * 8;
                if (local_60.dx_.num_elts < 0) {
                  uVar13 = 0xffffffffffffffff;
                }
                pvVar10 = operator_new__(uVar13);
                pdVar11[2] = (double)pvVar10;
                if (0 < iVar6) {
                  uVar13 = 0;
                  do {
                    *(double *)((long)pvVar10 + uVar13 * 8) = pdVar7[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar12 != uVar13);
                }
              }
              else if (0 < (int)uVar1) {
                dVar5 = pdVar11[2];
                uVar12 = 0;
                do {
                  *(double *)((long)dVar5 + uVar12 * 8) =
                       local_60.dx_.ptr_to_data[uVar12] + *(double *)((long)dVar5 + uVar12 * 8);
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
            }
            *pdVar11 = local_60.val_ + *pdVar11;
            Fad<double>::~Fad(&local_60);
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_40);
        }
      }
      else if (0 < (int)local_40) {
        uVar14 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_60,&x->fadexpr_,(int)uVar14);
          pdVar7 = local_60.dx_.ptr_to_data;
          iVar6 = local_60.dx_.num_elts;
          pdVar11 = (double *)(uVar14 * 0x20 + lVar4);
          uVar12 = (ulong)(uint)local_60.dx_.num_elts;
          if (uVar12 != 0) {
            uVar1 = *(uint *)(lVar4 + 8 + uVar14 * 0x20);
            if ((ulong)uVar1 == 0) {
              *(int *)(pdVar11 + 1) = local_60.dx_.num_elts;
              uVar13 = uVar12 * 8;
              if (local_60.dx_.num_elts < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              pvVar10 = operator_new__(uVar13);
              pdVar11[2] = (double)pvVar10;
              if (0 < iVar6) {
                uVar13 = 0;
                do {
                  *(double *)((long)pvVar10 + uVar13 * 8) = pdVar7[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar12 != uVar13);
              }
            }
            else if (0 < (int)uVar1) {
              dVar5 = pdVar11[2];
              uVar12 = 0;
              do {
                *(double *)((long)dVar5 + uVar12 * 8) =
                     local_60.dx_.ptr_to_data[uVar12] + *(double *)((long)dVar5 + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (uVar1 != uVar12);
            }
          }
          *pdVar11 = local_60.val_ + *pdVar11;
          Fad<double>::~Fad(&local_60);
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_40);
      }
    }
  }
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_60,&x->fadexpr_);
  pFVar8 = local_38;
  uVar14 = (ulong)(uint)local_60.dx_.num_elts;
  if (uVar14 != 0) {
    uVar1 = (local_38->val_).dx_.num_elts;
    if ((ulong)uVar1 == 0) {
      (local_38->val_).dx_.num_elts = local_60.dx_.num_elts;
      uVar12 = 0xffffffffffffffff;
      if (-1 < local_60.dx_.num_elts) {
        uVar12 = uVar14 * 8;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      (pFVar8->val_).dx_.ptr_to_data = pdVar11;
      if (0 < local_60.dx_.num_elts) {
        uVar12 = 0;
        do {
          pdVar11[uVar12] = local_60.dx_.ptr_to_data[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar11 = (local_38->val_).dx_.ptr_to_data;
      uVar14 = 0;
      do {
        pdVar11[uVar14] = local_60.dx_.ptr_to_data[uVar14] + pdVar11[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
  }
  (pFVar8->val_).val_ = local_60.val_ + (pFVar8->val_).val_;
  Fad<double>::~Fad(&local_60);
  return pFVar8;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}